

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoRcc.cxx
# Opt level: O0

void __thiscall cmQtAutoRcc::~cmQtAutoRcc(cmQtAutoRcc *this)

{
  cmQtAutoRcc *this_local;
  
  (this->super_cmQtAutoGenerator)._vptr_cmQtAutoGenerator = (_func_int **)&PTR__cmQtAutoRcc_00ac3f48
  ;
  std::__cxx11::string::~string((string *)&this->SettingsString_);
  std::__cxx11::string::~string((string *)&this->SettingsFile_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Inputs_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Options_);
  std::__cxx11::string::~string((string *)&this->Reason);
  std::__cxx11::string::~string((string *)&this->RccFilePublic_);
  std::__cxx11::string::~string((string *)&this->RccFileOutput_);
  std::__cxx11::string::~string((string *)&this->RccFileName_);
  std::__cxx11::string::~string((string *)&this->RccPathChecksum_);
  std::__cxx11::string::~string((string *)&this->QrcFileDir_);
  std::__cxx11::string::~string((string *)&this->QrcFileName_);
  std::__cxx11::string::~string((string *)&this->QrcFile_);
  cmFileLock::~cmFileLock(&this->LockFileLock_);
  std::__cxx11::string::~string((string *)&this->LockFile_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RccListOptions_);
  std::__cxx11::string::~string((string *)&this->RccExecutable_);
  std::__cxx11::string::~string((string *)&this->IncludeDir_);
  std::__cxx11::string::~string((string *)&this->AutogenBuildDir_);
  cmQtAutoGenerator::Logger::~Logger(&this->Logger_);
  cmQtAutoGenerator::~cmQtAutoGenerator(&this->super_cmQtAutoGenerator);
  return;
}

Assistant:

cmQtAutoRcc::~cmQtAutoRcc() = default;